

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGeometry.h
# Opt level: O2

ChMatrix33<double> *
chrono::utils::CalcConeGyration
          (ChMatrix33<double> *__return_storage_ptr__,double radius,double len,ChVector<double> *pos
          ,ChQuaternion<double> *rot)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = radius * radius * 0.15;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = len * len;
  auVar1 = vfmadd231sd_fma(auVar1,auVar2,ZEXT816(0x3fa3333333333333));
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)__return_storage_ptr__);
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar1._0_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       radius * radius * 0.3;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar1._0_8_;
  return __return_storage_ptr__;
}

Assistant:

inline ChMatrix33<> CalcConeGyration(double radius,
                                     double len,
                                     const ChVector<>& pos = ChVector<>(0, 0, 0),
                                     const ChQuaternion<>& rot = ChQuaternion<>(1, 0, 0, 0)) {
    double Ixx = (3.0 / 80.0) * (len * len) + (3.0 / 20.0) * (radius * radius);

    ChMatrix33<> J;
    J.setZero();
    J(0, 0) = Ixx;
    J(1, 1) = (3.0 / 10.0) * (radius * radius);
    J(2, 2) = Ixx;

    TransformGyration(J, pos, rot);

    return J;
}